

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridSequence::getCandidateConstructionPoints
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridSequence *this,
          TypeDepth type,int output,vector<int,_std::allocator<int>_> *level_limits)

{
  int iVar1;
  int local_74;
  undefined1 local_40 [4];
  int min_needed_points;
  vector<int,_std::allocator<int>_> weights;
  vector<int,_std::allocator<int>_> *level_limits_local;
  int output_local;
  TypeDepth type_local;
  GridSequence *this_local;
  
  weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)level_limits;
  ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  if ((((type == type_iptotal) || (type == type_ipcurved)) || (type == type_qptotal)) ||
     (type == type_qpcurved)) {
    if ((type == type_ipcurved) || (type == type_qpcurved)) {
      local_74 = (this->super_BaseCanonicalGrid).num_dimensions << 2;
    }
    else {
      local_74 = (this->super_BaseCanonicalGrid).num_dimensions << 1;
    }
    iVar1 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
    if (local_74 < iVar1) {
      estimateAnisotropicCoefficients
                (this,type,output,(vector<int,_std::allocator<int>_> *)local_40);
    }
  }
  getCandidateConstructionPoints
            (__return_storage_ptr__,this,type,(vector<int,_std::allocator<int>_> *)local_40,
             (vector<int,_std::allocator<int>_> *)
             weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> GridSequence::getCandidateConstructionPoints(TypeDepth type, int output, const std::vector<int> &level_limits){
    std::vector<int> weights;
    if ((type == type_iptotal) || (type == type_ipcurved) || (type == type_qptotal) || (type == type_qpcurved)){
        int min_needed_points = ((type == type_ipcurved) || (type == type_qpcurved)) ? 4 * num_dimensions : 2 * num_dimensions;
        if (points.getNumIndexes() > min_needed_points) // if there are enough points to estimate coefficients
            estimateAnisotropicCoefficients(type, output, weights);
    }
    return getCandidateConstructionPoints(type, weights, level_limits);
}